

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::PerspectiveCamera,pbrt::CameraBaseParameters&,float&,pbrt::Bounds2<float>&,float&,float&>
          (polymorphic_allocator<std::byte> *this,PerspectiveCamera *p,CameraBaseParameters *args,
          float *args_1,Bounds2<float> *args_2,float *args_3,float *args_4)

{
  CameraBaseParameters *in_RSI;
  Float in_stack_00000290;
  Float in_stack_00000294;
  Bounds2f *in_stack_00000298;
  Float in_stack_000002a4;
  CameraBaseParameters *in_stack_000002a8;
  PerspectiveCamera *in_stack_000002b0;
  CameraBaseParameters *in_stack_fffffffffffffc80;
  
  pbrt::CameraBaseParameters::CameraBaseParameters(in_stack_fffffffffffffc80,in_RSI);
  pbrt::PerspectiveCamera::PerspectiveCamera
            (in_stack_000002b0,in_stack_000002a8,in_stack_000002a4,in_stack_00000298,
             in_stack_00000294,in_stack_00000290);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }